

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void cmGlobalNinjaGenerator::WriteRule(ostream *os,cmNinjaRule *rule)

{
  ostream *poVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_40;
  size_type local_28;
  pointer local_20;
  undefined8 local_18;
  
  if ((rule->Name)._M_string_length == 0) {
    local_40.first._M_len = 0x32;
    local_40.first._M_str = "No name given for WriteRule! called with comment: ";
    local_40.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_20 = (rule->Comment)._M_dataplus._M_p;
    local_28 = (rule->Comment)._M_string_length;
    local_18 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_40;
    cmCatViews(&local_60,views_00);
    cmSystemTools::Error(&local_60);
  }
  else if ((rule->Command)._M_string_length == 0) {
    local_40.first._M_len = 0x35;
    local_40.first._M_str = "No command given for WriteRule! called with comment: ";
    local_40.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_20 = (rule->Comment)._M_dataplus._M_p;
    local_28 = (rule->Comment)._M_string_length;
    local_18 = 0;
    views_01._M_len = 2;
    views_01._M_array = &local_40;
    cmCatViews(&local_60,views_01);
    cmSystemTools::Error(&local_60);
  }
  else {
    if (((rule->RspFile)._M_string_length == 0) || ((rule->RspContent)._M_string_length != 0)) {
      WriteComment(os,&rule->Comment);
      std::__ostream_insert<char,std::char_traits<char>>(os,"rule ",5);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(rule->Name)._M_dataplus._M_p,(rule->Name)._M_string_length);
      local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
      if ((rule->DepFile)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"depfile",7);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->DepFile)._M_dataplus._M_p,(rule->DepFile)._M_string_length);
        local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
      }
      if ((rule->DepType)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"deps",4);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->DepType)._M_dataplus._M_p,(rule->DepType)._M_string_length);
        local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
      }
      if ((rule->Command)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"command",7);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->Command)._M_dataplus._M_p,(rule->Command)._M_string_length);
        local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
      }
      if ((rule->Description)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"description",0xb);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->Description)._M_dataplus._M_p,
                            (rule->Description)._M_string_length);
        local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
      }
      if ((rule->RspFile)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"rspfile",7);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->RspFile)._M_dataplus._M_p,(rule->RspFile)._M_string_length);
        local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
        if ((rule->RspContent)._M_string_length != 0) {
          Indent(os,1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"rspfile_content",0xf);
          std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(rule->RspContent)._M_dataplus._M_p,
                              (rule->RspContent)._M_string_length);
          local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
        }
      }
      if ((rule->Restat)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"restat",6);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->Restat)._M_dataplus._M_p,(rule->Restat)._M_string_length);
        local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
      }
      if (rule->Generator == true) {
        local_40.first._M_len = (size_t)&local_40.second;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"1","");
        if (local_40.first._M_str != (char *)0x0) {
          Indent(os,1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"generator",9);
          std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)local_40.first._M_len,(long)local_40.first._M_str);
          local_60._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            local_40.first._M_len != &local_40.second) {
          operator_delete((void *)local_40.first._M_len,
                          (ulong)((long)&((local_40.second)->_M_dataplus)._M_p + 1));
        }
      }
      local_40.first._M_len = CONCAT71(local_40.first._M_len._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
      return;
    }
    local_40.first._M_len = 0x49;
    local_40.first._M_str =
         "rspfile but no rspfile_content given for WriteRule! called with comment: ";
    local_40.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_20 = (rule->Comment)._M_dataplus._M_p;
    local_28 = (rule->Comment)._M_string_length;
    local_18 = 0;
    views._M_len = 2;
    views._M_array = &local_40;
    cmCatViews(&local_60,views);
    cmSystemTools::Error(&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteRule(std::ostream& os,
                                       cmNinjaRule const& rule)
{
  // -- Parameter checks
  // Make sure the rule has a name.
  if (rule.Name.empty()) {
    cmSystemTools::Error(cmStrCat(
      "No name given for WriteRule! called with comment: ", rule.Comment));
    return;
  }

  // Make sure a command is given.
  if (rule.Command.empty()) {
    cmSystemTools::Error(cmStrCat(
      "No command given for WriteRule! called with comment: ", rule.Comment));
    return;
  }

  // Make sure response file content is given
  if (!rule.RspFile.empty() && rule.RspContent.empty()) {
    cmSystemTools::Error(
      cmStrCat("rspfile but no rspfile_content given for WriteRule! "
               "called with comment: ",
               rule.Comment));
    return;
  }

  // -- Write rule
  // Write rule intro
  cmGlobalNinjaGenerator::WriteComment(os, rule.Comment);
  os << "rule " << rule.Name << '\n';

  // Write rule key/value pairs
  auto writeKV = [&os](const char* key, std::string const& value) {
    if (!value.empty()) {
      cmGlobalNinjaGenerator::Indent(os, 1);
      os << key << " = " << value << '\n';
    }
  };

  writeKV("depfile", rule.DepFile);
  writeKV("deps", rule.DepType);
  writeKV("command", rule.Command);
  writeKV("description", rule.Description);
  if (!rule.RspFile.empty()) {
    writeKV("rspfile", rule.RspFile);
    writeKV("rspfile_content", rule.RspContent);
  }
  writeKV("restat", rule.Restat);
  if (rule.Generator) {
    writeKV("generator", "1");
  }

  // Finish rule
  os << '\n';
}